

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplicialCholesky.h
# Opt level: O1

void __thiscall
Eigen::
SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,0,int>,1,Eigen::AMDOrdering<int>>>
::_solve_impl<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
          (SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,0,int>,1,Eigen::AMDOrdering<int>>>
           *this,MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *b,
          MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *dest)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  double *pdVar3;
  double *pdVar4;
  PointerType piVar5;
  SparseMatrix<double,_0,_int> *pSVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  Scalar SVar12;
  long lVar13;
  ulong uVar14;
  ActualDstType actualDst;
  long lVar15;
  long lVar16;
  undefined1 auVar17 [16];
  scalar_sum_op<int,_int> local_61;
  undefined1 local_60 [8];
  Transpose<const_Eigen::SparseMatrix<double,_0,_int>_> local_58;
  XprType *local_48;
  XprType local_40;
  
  if (*(int *)(this + 4) == 0) {
    lVar13 = *(long *)(this + 0x90);
    if (lVar13 < 1) {
      lVar13 = *(long *)b;
      if (*(long *)(dest + 8) != *(long *)(b + 8)) {
        PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)dest,*(long *)(b + 8)
                   ,1);
      }
      lVar7 = *(long *)dest;
      uVar8 = *(ulong *)(dest + 8);
      uVar14 = uVar8 - ((long)uVar8 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < (long)uVar8) {
        lVar15 = 0;
        do {
          puVar1 = (undefined8 *)(lVar13 + lVar15 * 8);
          uVar10 = puVar1[1];
          puVar2 = (undefined8 *)(lVar7 + lVar15 * 8);
          *puVar2 = *puVar1;
          puVar2[1] = uVar10;
          lVar15 = lVar15 + 2;
        } while (lVar15 < (long)uVar14);
      }
      if ((long)uVar14 < (long)uVar8) {
        do {
          *(undefined8 *)(lVar7 + uVar14 * 8) = *(undefined8 *)(lVar13 + uVar14 * 8);
          uVar14 = uVar14 + 1;
        } while (uVar8 != uVar14);
      }
    }
    else {
      if (*(long *)(dest + 8) != lVar13) {
        PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)dest,lVar13,1);
      }
      internal::
      permutation_matrix_product<Eigen::Matrix<double,-1,1,0,-1,1>,1,false,Eigen::DenseShape>::
      run<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::PermutationMatrix<_1,_1,int>>
                ((Matrix<double,__1,_1,_0,__1,_1> *)dest,
                 (PermutationMatrix<_1,__1,_int> *)(this + 0x88),
                 (Matrix<double,__1,_1,_0,__1,_1> *)b);
    }
    piVar5 = *(PointerType *)(this + 0x30);
    if (piVar5 == (PointerType)0x0) {
      lVar13 = (long)(*(int **)(this + 0x28))[*(long *)(this + 0x18)] -
               (long)**(int **)(this + 0x28);
    }
    else {
      pSVar6 = *(SparseMatrix<double,_0,_int> **)(this + 0x18);
      if (pSVar6 == (SparseMatrix<double,_0,_int> *)0x0) {
        lVar13 = 0;
      }
      else {
        local_48 = &local_40;
        local_60 = (undefined1  [8])piVar5;
        local_58.m_matrix = pSVar6;
        local_40.
        super_MapBase<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = piVar5;
        local_40.
        super_MapBase<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value = (long)pSVar6;
        SVar12 = internal::
                 redux_impl<Eigen::internal::scalar_sum_op<int,_int>,_Eigen::internal::redux_evaluator<Eigen::Map<const_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_3,_0>
                 ::run((redux_evaluator<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                        *)local_60,&local_61);
        lVar13 = (long)SVar12;
      }
    }
    if (0 < lVar13) {
      internal::
      sparse_solve_triangular_selector<const_Eigen::SparseMatrix<double,_0,_int>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_5,_1,_0>
      ::run((SparseMatrix<double,_0,_int> *)(this + 0x10),(Matrix<double,__1,_1,_0,__1,_1> *)dest);
    }
    lVar13 = *(long *)(this + 0x60);
    if (0 < lVar13) {
      lVar7 = *(long *)(this + 0x58);
      lVar15 = *(long *)dest;
      if (*(long *)(dest + 8) != lVar13) {
        PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)dest,lVar13,1);
      }
      auVar11 = _DAT_0019b850;
      lVar13 = *(long *)dest;
      uVar8 = *(ulong *)(dest + 8);
      uVar14 = uVar8 - ((long)uVar8 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < (long)uVar8) {
        lVar16 = 0;
        do {
          auVar17 = divpd(auVar11,*(undefined1 (*) [16])(lVar7 + lVar16 * 8));
          pdVar4 = (double *)(lVar15 + lVar16 * 8);
          dVar9 = pdVar4[1];
          pdVar3 = (double *)(lVar13 + lVar16 * 8);
          *pdVar3 = auVar17._0_8_ * *pdVar4;
          pdVar3[1] = auVar17._8_8_ * dVar9;
          lVar16 = lVar16 + 2;
        } while (lVar16 < (long)uVar14);
      }
      if ((long)uVar14 < (long)uVar8) {
        do {
          *(double *)(lVar13 + uVar14 * 8) =
               (1.0 / *(double *)(lVar7 + uVar14 * 8)) * *(double *)(lVar15 + uVar14 * 8);
          uVar14 = uVar14 + 1;
        } while (uVar8 != uVar14);
      }
    }
    piVar5 = *(PointerType *)(this + 0x30);
    if (piVar5 == (PointerType)0x0) {
      lVar13 = (long)(*(int **)(this + 0x28))[*(long *)(this + 0x18)] -
               (long)**(int **)(this + 0x28);
    }
    else {
      pSVar6 = *(SparseMatrix<double,_0,_int> **)(this + 0x18);
      if (pSVar6 == (SparseMatrix<double,_0,_int> *)0x0) {
        lVar13 = 0;
      }
      else {
        local_48 = &local_40;
        local_60 = (undefined1  [8])piVar5;
        local_58.m_matrix = pSVar6;
        local_40.
        super_MapBase<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = piVar5;
        local_40.
        super_MapBase<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value = (long)pSVar6;
        SVar12 = internal::
                 redux_impl<Eigen::internal::scalar_sum_op<int,_int>,_Eigen::internal::redux_evaluator<Eigen::Map<const_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_3,_0>
                 ::run((redux_evaluator<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                        *)local_60,&local_61);
        lVar13 = (long)SVar12;
      }
    }
    if (0 < lVar13) {
      local_60 = (undefined1  [8])((ulong)local_60 & 0xffffffffffffff00);
      local_58.super_TransposeImpl<const_Eigen::SparseMatrix<double,_0,_int>,_Eigen::Sparse>.
      super_SparseTransposeImpl<const_Eigen::SparseMatrix<double,_0,_int>,_1024>.
      super_SparseCompressedBase<Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>_>.
      super_SparseMatrixBase<Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>_>.
      m_isRValue = (SparseTransposeImpl<const_Eigen::SparseMatrix<double,_0,_int>,_1024>)
                   (SparseCompressedBase<Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>_>
                    )0x0;
      local_58.m_matrix = (SparseMatrix<double,_0,_int> *)(this + 0x10);
      internal::
      sparse_solve_triangular_selector<const_Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_6,_2,_1>
      ::run(&local_58,(Matrix<double,__1,_1,_0,__1,_1> *)dest);
    }
    if (0 < *(long *)(this + 0x90)) {
      if (*(long *)(dest + 8) != *(long *)(this + 0xa0)) {
        PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)dest,
                   *(long *)(this + 0xa0),1);
      }
      internal::
      permutation_matrix_product<Eigen::Matrix<double,-1,1,0,-1,1>,1,false,Eigen::DenseShape>::
      run<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::PermutationMatrix<_1,_1,int>>
                ((Matrix<double,__1,_1,_0,__1,_1> *)dest,
                 (PermutationMatrix<_1,__1,_int> *)(this + 0x98),
                 (Matrix<double,__1,_1,_0,__1,_1> *)dest);
    }
    return;
  }
  return;
}

Assistant:

void _solve_impl(const MatrixBase<Rhs> &b, MatrixBase<Dest> &dest) const
    {
      eigen_assert(m_factorizationIsOk && "The decomposition is not in a valid state for solving, you must first call either compute() or symbolic()/numeric()");
      eigen_assert(m_matrix.rows()==b.rows());

      if(m_info!=Success)
        return;

      if(m_P.size()>0)
        dest = m_P * b;
      else
        dest = b;

      if(m_matrix.nonZeros()>0) // otherwise L==I
        derived().matrixL().solveInPlace(dest);

      if(m_diag.size()>0)
        dest = m_diag.asDiagonal().inverse() * dest;

      if (m_matrix.nonZeros()>0) // otherwise U==I
        derived().matrixU().solveInPlace(dest);

      if(m_P.size()>0)
        dest = m_Pinv * dest;
    }